

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

string * ZXing::ToString_abi_cxx11_(Error *e)

{
  ulong uVar1;
  Error *in_RSI;
  string *in_RDI;
  string location;
  char *name [4];
  string *ret;
  string *__lhs;
  string local_f0 [16];
  allocator<char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [40];
  Error *in_stack_ffffffffffffffb8;
  allocator<char> local_3a;
  undefined1 local_39;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  char *pcStack_20;
  Error *local_10;
  
  local_28 = "ChecksumError";
  pcStack_20 = "Unsupported";
  local_38 = "";
  pcStack_30 = "FormatError";
  local_39 = 0;
  __lhs = in_RDI;
  local_10 = in_RSI;
  Error::type(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<char>::~allocator(&local_3a);
  Error::msg_abi_cxx11_(local_10);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Error::msg_abi_cxx11_(local_10);
    std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::operator+(__lhs,(char *)in_RDI);
    std::__cxx11::string::operator+=((string *)__lhs,local_70);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
  }
  Error::location_abi_cxx11_(in_stack_ffffffffffffffb8);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Error::location_abi_cxx11_(in_stack_ffffffffffffffb8);
    std::operator+((char *)__lhs,in_RDI);
    std::__cxx11::string::operator+=((string *)__lhs,(string *)&stack0xffffffffffffff30);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    std::__cxx11::string::~string(local_f0);
  }
  std::__cxx11::string::~string(local_b0);
  return in_RDI;
}

Assistant:

std::string ToString(const Error& e)
{
	const char* name[] = {"", "FormatError", "ChecksumError", "Unsupported"};
	std::string ret = name[static_cast<int>(e.type())];
	if (!e.msg().empty())
		ret += " (" + e.msg() + ")";
	if (auto location = e.location(); !location.empty())
		ret += " @ " + e.location();
	return ret;
}